

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O1

void __thiscall leveldb::_Test_TestTwoBoundaryFiles::_Run(_Test_TestTwoBoundaryFiles *this)

{
  pointer *pppFVar1;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *this_00;
  iterator iVar2;
  FileMetaData *pFVar3;
  FileMetaData *f1;
  FileMetaData *f3;
  FileMetaData *f2;
  FileMetaData *local_2a8;
  FileMetaData *local_2a0;
  FileMetaData *local_298;
  Slice local_290;
  int local_27c;
  InternalKey local_278;
  InternalKey local_258;
  InternalKey local_238;
  InternalKey local_218;
  InternalKey local_1f8;
  InternalKey local_1d8;
  Tester local_1b8;
  
  local_1b8._0_8_ = "100";
  local_1b8.fname_ = (char *)0x3;
  InternalKey::InternalKey(&local_1d8,(Slice *)&local_1b8,6,kTypeValue);
  local_290.data_ = "100";
  local_290.size_ = 3;
  InternalKey::InternalKey(&local_1f8,&local_290,5,kTypeValue);
  pFVar3 = AddBoundaryInputsTest::CreateFileMetaData
                     (&this->super_AddBoundaryInputsTest,1,&local_1d8,&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.rep_._M_dataplus._M_p != &local_1f8.rep_.field_2) {
    operator_delete(local_1f8.rep_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.rep_._M_dataplus._M_p != &local_1d8.rep_.field_2) {
    operator_delete(local_1d8.rep_._M_dataplus._M_p);
  }
  local_1b8._0_8_ = "100";
  local_1b8.fname_ = (char *)0x3;
  local_2a8 = pFVar3;
  InternalKey::InternalKey(&local_218,(Slice *)&local_1b8,2,kTypeValue);
  local_290.data_ = "300";
  local_290.size_ = 3;
  InternalKey::InternalKey(&local_238,&local_290,1,kTypeValue);
  pFVar3 = AddBoundaryInputsTest::CreateFileMetaData
                     (&this->super_AddBoundaryInputsTest,1,&local_218,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.rep_._M_dataplus._M_p != &local_238.rep_.field_2) {
    operator_delete(local_238.rep_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218.rep_._M_dataplus._M_p != &local_218.rep_.field_2) {
    operator_delete(local_218.rep_._M_dataplus._M_p);
  }
  local_1b8._0_8_ = "100";
  local_1b8.fname_ = (char *)0x3;
  local_298 = pFVar3;
  InternalKey::InternalKey(&local_258,(Slice *)&local_1b8,4,kTypeValue);
  local_290.data_ = "100";
  local_290.size_ = 3;
  InternalKey::InternalKey(&local_278,&local_290,3,kTypeValue);
  pFVar3 = AddBoundaryInputsTest::CreateFileMetaData
                     (&this->super_AddBoundaryInputsTest,1,&local_258,&local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278.rep_._M_dataplus._M_p != &local_278.rep_.field_2) {
    operator_delete(local_278.rep_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.rep_._M_dataplus._M_p != &local_258.rep_.field_2) {
    operator_delete(local_258.rep_._M_dataplus._M_p);
  }
  iVar2._M_current =
       (this->super_AddBoundaryInputsTest).level_files_.
       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl
       .super__Vector_impl_data._M_finish;
  local_2a0 = pFVar3;
  if (iVar2._M_current ==
      (this->super_AddBoundaryInputsTest).level_files_.
      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
    _M_realloc_insert<leveldb::FileMetaData*const&>
              ((vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *)this,iVar2,
               &local_298);
  }
  else {
    *iVar2._M_current = local_298;
    pppFVar1 = &(this->super_AddBoundaryInputsTest).level_files_.
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppFVar1 = *pppFVar1 + 1;
  }
  iVar2._M_current =
       (this->super_AddBoundaryInputsTest).level_files_.
       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->super_AddBoundaryInputsTest).level_files_.
      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
    _M_realloc_insert<leveldb::FileMetaData*const&>
              ((vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *)this,iVar2,
               &local_2a0);
  }
  else {
    *iVar2._M_current = local_2a0;
    pppFVar1 = &(this->super_AddBoundaryInputsTest).level_files_.
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppFVar1 = *pppFVar1 + 1;
  }
  iVar2._M_current =
       (this->super_AddBoundaryInputsTest).level_files_.
       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->super_AddBoundaryInputsTest).level_files_.
      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
    _M_realloc_insert<leveldb::FileMetaData*const&>
              ((vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *)this,iVar2,
               &local_2a8);
  }
  else {
    *iVar2._M_current = local_2a8;
    pppFVar1 = &(this->super_AddBoundaryInputsTest).level_files_.
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppFVar1 = *pppFVar1 + 1;
  }
  this_00 = &(this->super_AddBoundaryInputsTest).compaction_files_;
  iVar2._M_current =
       (this->super_AddBoundaryInputsTest).compaction_files_.
       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->super_AddBoundaryInputsTest).compaction_files_.
      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
    _M_realloc_insert<leveldb::FileMetaData*const&>
              ((vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *)this_00,
               iVar2,&local_2a8);
  }
  else {
    *iVar2._M_current = local_2a8;
    pppFVar1 = &(this->super_AddBoundaryInputsTest).compaction_files_.
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppFVar1 = *pppFVar1 + 1;
  }
  AddBoundaryInputs(&(this->super_AddBoundaryInputsTest).icmp_,
                    (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                    this,this_00);
  local_1b8.ok_ = true;
  local_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set_test.cc"
  ;
  local_1b8.line_ = 0x129;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1b8 + 0x18));
  local_27c = 3;
  local_290.data_ =
       (char *)((long)(this->super_AddBoundaryInputsTest).compaction_files_.
                      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->super_AddBoundaryInputsTest).compaction_files_.
                      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3);
  test::Tester::IsEq<int,unsigned_long>(&local_1b8,&local_27c,(unsigned_long *)&local_290);
  test::Tester::~Tester(&local_1b8);
  local_1b8.ok_ = true;
  local_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set_test.cc"
  ;
  local_1b8.line_ = 0x12a;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1b8 + 0x18));
  test::Tester::IsEq<leveldb::FileMetaData*,leveldb::FileMetaData*>
            (&local_1b8,&local_2a8,
             (this_00->
             super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
             _M_impl.super__Vector_impl_data._M_start);
  test::Tester::~Tester(&local_1b8);
  local_1b8.ok_ = true;
  local_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set_test.cc"
  ;
  local_1b8.line_ = 299;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1b8 + 0x18));
  test::Tester::IsEq<leveldb::FileMetaData*,leveldb::FileMetaData*>
            (&local_1b8,&local_2a0,
             (this_00->
             super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
             _M_impl.super__Vector_impl_data._M_start + 1);
  test::Tester::~Tester(&local_1b8);
  local_1b8.ok_ = true;
  local_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set_test.cc"
  ;
  local_1b8.line_ = 300;
  std::__cxx11::stringstream::stringstream((stringstream *)((long)&local_1b8 + 0x18));
  test::Tester::IsEq<leveldb::FileMetaData*,leveldb::FileMetaData*>
            (&local_1b8,&local_298,
             (this_00->
             super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
             _M_impl.super__Vector_impl_data._M_start + 2);
  test::Tester::~Tester(&local_1b8);
  return;
}

Assistant:

TEST(AddBoundaryInputsTest, TestTwoBoundaryFiles) {
  FileMetaData* f1 =
      CreateFileMetaData(1, InternalKey("100", 6, kTypeValue),
                         InternalKey(InternalKey("100", 5, kTypeValue)));
  FileMetaData* f2 =
      CreateFileMetaData(1, InternalKey("100", 2, kTypeValue),
                         InternalKey(InternalKey("300", 1, kTypeValue)));
  FileMetaData* f3 =
      CreateFileMetaData(1, InternalKey("100", 4, kTypeValue),
                         InternalKey(InternalKey("100", 3, kTypeValue)));

  level_files_.push_back(f2);
  level_files_.push_back(f3);
  level_files_.push_back(f1);
  compaction_files_.push_back(f1);

  AddBoundaryInputs(icmp_, level_files_, &compaction_files_);
  ASSERT_EQ(3, compaction_files_.size());
  ASSERT_EQ(f1, compaction_files_[0]);
  ASSERT_EQ(f3, compaction_files_[1]);
  ASSERT_EQ(f2, compaction_files_[2]);
}